

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

int cimg_library::cimg::strcasecmp(char *__s1,char *__s2)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (__s1 != (char *)0x0) {
    sVar2 = strlen(__s1);
    sVar3 = strlen(__s2);
    iVar1 = (int)sVar2;
    if ((int)sVar3 <= (int)sVar2) {
      iVar1 = (int)sVar3;
    }
    iVar1 = strncasecmp(__s1,__s2,(ulong)(iVar1 + 1));
    return iVar1;
  }
  return -(uint)(__s2 != (char *)0x0);
}

Assistant:

inline int strcasecmp(const char *const str1, const char *const str2) {
      if (!str1) return str2?-1:0;
      const int
        l1 = (int)std::strlen(str1),
        l2 = (int)std::strlen(str2);
      return cimg::strncasecmp(str1,str2,1 + (l1<l2?l1:l2));
    }